

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_score(tgestate_t *state)

{
  uint8_t *puVar1;
  long lVar2;
  char digit;
  char local_19;
  
  puVar1 = (state->speccy->screen).pixels + 0x1094;
  lVar2 = 0x6e9;
  do {
    local_19 = *(char *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x20) + '0';
    puVar1 = plot_glyph(state,&local_19,puVar1);
    puVar1 = puVar1 + 1;
    lVar2 = lVar2 + 1;
  } while ((char)lVar2 != -0x12);
  return;
}

Assistant:

void plot_score(tgestate_t *state)
{
  char    *digits; /* was HL */
  uint8_t *screen; /* was DE */
  uint8_t  iters;  /* was B */

  assert(state != NULL);

  digits = &state->score_digits[0];
  screen = &state->speccy->screen.pixels[score_address];
  iters = NELEMS(state->score_digits);
  do
  {
    char digit = '0' + *digits; /* Conv: Pass as ASCII. */

    screen = plot_glyph(state, &digit, screen);
    digits++;
    screen++; /* Additionally to plot_glyph, so screen += 2 each iter. */
  }
  while (--iters);
}